

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O1

bool pybind11::detail::deregister_instance_impl(void *ptr,instance *self)

{
  bool bVar1;
  _Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false> it;
  internals *piVar2;
  _Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false> __it;
  bool bVar3;
  pair<std::__detail::_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>_>
  pVar4;
  void *local_28;
  void *ptr_local;
  
  local_28 = ptr;
  piVar2 = get_internals();
  pVar4 = std::
          _Hashtable<const_void_*,_std::pair<const_void_*const,_pybind11::detail::instance_*>,_std::allocator<std::pair<const_void_*const,_pybind11::detail::instance_*>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
          ::equal_range(&(piVar2->registered_instances)._M_h,&local_28);
  __it._M_cur = (__node_type *)
                pVar4.first.
                super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                ._M_cur;
  while( true ) {
    bVar3 = __it._M_cur ==
            (__node_type *)
            pVar4.second.
            super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
            ._M_cur;
    bVar1 = !bVar3;
    if (bVar3) {
      return bVar1;
    }
    if (*(instance **)((long)__it._M_cur + 0x10) == self) break;
    __it._M_cur = *__it._M_cur;
  }
  std::
  _Hashtable<const_void_*,_std::pair<const_void_*const,_pybind11::detail::instance_*>,_std::allocator<std::pair<const_void_*const,_pybind11::detail::instance_*>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  ::erase(&(piVar2->registered_instances)._M_h,(const_iterator)__it._M_cur);
  return bVar1;
}

Assistant:

inline bool deregister_instance_impl(void *ptr, instance *self) {
    auto &registered_instances = get_internals().registered_instances;
    auto range = registered_instances.equal_range(ptr);
    for (auto it = range.first; it != range.second; ++it) {
        if (self == it->second) {
            registered_instances.erase(it);
            return true;
        }
    }
    return false;
}